

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::getBoolean(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception,
                    bool igncache)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  invalid_argument *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  byte in_DL;
  char *in_RSI;
  GenericException *ex;
  IBoolean *val;
  INode *node;
  bool ret;
  IBase *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  long *local_1a0;
  allocator local_159;
  string local_158 [32];
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  long *local_88;
  gcstring local_70 [80];
  long local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  char *local_10;
  long lVar4;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = 0;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12e323);
  GenICam_3_4::gcstring::gcstring(local_70,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_70);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_70);
  local_20 = lVar4;
  if (lVar4 == 0) {
    if ((local_11 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"Feature not found: ",&local_159);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe20);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_138);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffffe20);
    if (bVar1) {
      if (local_20 == 0) {
        local_1a0 = (long *)0x0;
      }
      else {
        local_1a0 = (long *)__dynamic_cast(local_20,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
      }
      local_88 = local_1a0;
      if (local_1a0 == (long *)0x0) {
        if ((local_11 & 1) != 0) {
          local_ca = 1;
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"Feature not boolean: ",&local_c9);
          std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
          std::invalid_argument::invalid_argument(piVar5,local_a8);
          local_ca = 0;
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_13 = (**(code **)(*local_1a0 + 0x48))(local_1a0,0,local_12 & 1);
        local_13 = local_13 & 1;
      }
    }
    else if ((local_11 & 1) != 0) {
      local_112 = 1;
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Feature not readable: ",&local_111);
      std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
      std::invalid_argument::invalid_argument(piVar5,local_f0);
      local_112 = 0;
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return (bool)(local_13 & 1);
}

Assistant:

bool getBoolean(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                bool exception, bool igncache)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IBoolean *val=dynamic_cast<GenApi::IBoolean *>(node);

        if (val != 0)
        {
          ret=val->GetValue(false, igncache);
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not boolean: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}